

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_map_test.cpp
# Opt level: O1

void __thiscall
metacall_map_test_DefaultConstructor_Test::TestBody(metacall_map_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  pointer *__ptr;
  char *message;
  metacall_allocator_std_type std_ctx;
  Message local_48;
  AssertHelper local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  code *local_28;
  
  metacall_print_info();
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_40.data_._0_4_ = metacall_initialize();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"(int)0","(int)metacall_initialize()",(int *)&local_48,
             (int *)&local_40);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_48);
    if ((undefined8 *)CONCAT44(uStack_2c,uStack_30) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT44(uStack_2c,uStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_map_test/source/metacall_map_test.cpp"
               ,0x24,message);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_2c,uStack_30);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  if (local_38._0_1_ != (internal)0x0) {
    local_28 = free;
    local_38 = 0x14c3d8;
    uStack_34 = 0;
    uStack_30 = 0x14c4e0;
    uStack_2c = 0;
    uVar2 = metacall_allocator_create(0);
    metacall_allocator_destroy(uVar2);
    metacall_destroy();
  }
  return;
}

Assistant:

TEST_F(metacall_map_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

	void *allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
		const char *py_scripts[] = {
			"example.py"
		};

		const long seven_multiples_limit = 10;

		long iterator;

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("py", py_scripts, sizeof(py_scripts) / sizeof(py_scripts[0]), NULL));

		static const char left[] = "left";
		static const char right[] = "right";

		void *keys[] = {
			metacall_value_create_string(left, sizeof(left) - 1),
			metacall_value_create_string(right, sizeof(right) - 1)
		};

		void *values[] = {
			metacall_value_create_long(7),
			metacall_value_create_long(0)
		};

		static const char args_map[] = "{\"left\":10,\"right\":2}";
		static const char args_array[] = "[10, 2]";

		void *func = metacall_function("multiply");

		ASSERT_NE((void *)NULL, (void *)func);

		/* Call by map using arrays */
		for (iterator = 0; iterator <= seven_multiples_limit; ++iterator)
		{
			values[1] = metacall_value_from_long(values[1], iterator);

			ret = metacallfmv(func, keys, values);

			EXPECT_NE((void *)NULL, (void *)ret);

			EXPECT_EQ((long)metacall_value_to_long(ret), (long)(7 * iterator));

			metacall_value_destroy(ret);
		}

		metacall_value_destroy(keys[0]);
		metacall_value_destroy(keys[1]);

		metacall_value_destroy(values[0]);
		metacall_value_destroy(values[1]);

		/* Call by map using serial */
		ret = metacallfms(func, args_map, sizeof(args_map), allocator);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)20);

		metacall_value_destroy(ret);

		/* Call by array using serial */
		ret = metacallfs(func, args_array, sizeof(args_array), allocator);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)20);

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_PY */

/* NodeJS */
#if defined(OPTION_BUILD_LOADERS_NODE)
	{
		const char *node_scripts[] = {
			"nod.js"
		};

		const enum metacall_value_id double_ids[] = {
			METACALL_DOUBLE, METACALL_DOUBLE
		};

		static const char args_map[] = "{\"a\":10,\"b\":2}";
		static const char args_bad_map[] = "{a:10,b:2}";
		static const char args_array[] = "[10, 2]";
		static const char args_bad_array[] = "[10 2";

		EXPECT_EQ((int)0, (int)metacall_load_from_file("node", node_scripts, sizeof(node_scripts) / sizeof(node_scripts[0]), NULL));

		void *func = metacall_function("call_test");

		ASSERT_NE((void *)NULL, (void *)func);

		void *ret = metacallt("call_test", double_ids, 10.0, 2.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)20.0);

		metacall_value_destroy(ret);

		/* Call by map using serial */
		ret = metacallfms(func, args_map, sizeof(args_map), allocator);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)20.0);

		metacall_value_destroy(ret);

		/* Bad call by map using serial */
		ret = metacallfms(func, args_bad_map, sizeof(args_bad_map), allocator);

		EXPECT_EQ((void *)NULL, (void *)ret);

		/* Call by array using serial */
		ret = metacallfs(func, args_array, sizeof(args_array), allocator);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)20.0);

		metacall_value_destroy(ret);

		/* Bad call by array using serial */
		ret = metacallfs(func, args_bad_array, sizeof(args_bad_array), allocator);

		EXPECT_EQ((void *)NULL, (void *)ret);

		/* TODO: Implement spread operator */
		/*
		static const char buffer[] =
			"function spread_parameter(...args) {\n"
			"  console.log(args);\n"
			"  return 'ACK: OK!';\n"
			"}\n"
			"module.exports = {\n"
			"  spread_parameter,\n"
			"};\n";

		EXPECT_EQ((int)0, (int)metacall_load_from_memory("node", buffer, sizeof(buffer), NULL));

		static const char args_map_spread[] =
			"{\n"
			"    \"id\": \"5555555-0000027\",\n"
			"    \"loanType\": \"Retail\",\n"
			"    \"lendingCategory\": \"Yeet\",\n"
			"    \"comments\": {\n"
			"        \"comment\": \"Rich-Test via Concert/Postman (Auto Approve - Attempt)\"\n"
			"    }\n"
			"}\n";

		func = metacall_function("spread_parameter");

		ret = metacallfms(func, args_map_spread, sizeof(args_map_spread), allocator);

		ASSERT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "ACK: OK!"));

		metacall_value_destroy(ret);
		*/
	}
#endif /* OPTION_BUILD_LOADERS_NODE */

	metacall_allocator_destroy(allocator);

	metacall_destroy();
}